

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void kratos::check_non_synthesizable_content(Generator *top)

{
  pointer ppIVar1;
  UserException *this;
  const_iterator __begin0;
  __node_base_ptr p_Var2;
  undefined1 local_a0 [8];
  SynthesizableVisitor visitor;
  IRNode *local_30 [2];
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_a0 = (undefined1  [8])&PTR_visit_root_002de3a8;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  IRVisitor::visit_root((IRVisitor *)local_a0,&top->super_IRNode);
  ppIVar1 = visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  p_Var2 = visitor.super_IRVisitor.visited_._M_h._M_single_bucket;
  if (visitor.super_IRVisitor.visited_._M_h._M_single_bucket ==
      (__node_base_ptr)
      visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl
      .super__Vector_impl_data._M_start) {
    local_a0 = (undefined1  [8])&PTR_visit_root_002de3a8;
    if (visitor.super_IRVisitor.visited_._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      operator_delete(visitor.super_IRVisitor.visited_._M_h._M_single_bucket,
                      (long)visitor.nodes_.
                            super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
    }
    local_a0 = (undefined1  [8])&PTR_visit_root_002d9288;
    std::
    _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&visitor.super_IRVisitor.level);
    return;
  }
  do {
    if ((IRNode *)p_Var2->_M_nxt != (IRNode *)0x0) {
      print_ast_node((IRNode *)p_Var2->_M_nxt);
    }
    p_Var2 = p_Var2 + 1;
  } while (p_Var2 != (__node_base_ptr)ppIVar1);
  this = (UserException *)__cxa_allocate_exception(0x10);
  visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "Non-synthesizable content detected. Please see the relevant lines output above (after using debug mode)"
             ,"");
  UserException::UserException
            (this,(string *)
                  &visitor.nodes_.
                   super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  __cxa_throw(this,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_non_synthesizable_content(Generator* top) {
    SynthesizableVisitor visitor;
    visitor.visit_root(top);
    auto const& nodes = visitor.nodes();
    if (!nodes.empty()) {
        print_nodes(nodes);
        throw UserException(
            "Non-synthesizable content detected. Please see the relevant lines "
            "output above (after using debug mode)");
    }
}